

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O0

void test_comments_4(void)

{
  char *in_stack_00000590;
  char *in_stack_00000598;
  char *in_stack_000005a0;
  char *in_stack_000005a8;
  char *in_stack_000005b0;
  
  run(in_stack_000005b0,in_stack_000005a8,in_stack_000005a0,in_stack_00000598,in_stack_00000590);
  return;
}

Assistant:

static void
test_comments_4(void)
{
    run(
        "all standalone comment lines should be removed",
        "Begin.\n  {{! Indented Comment Block! }}\nEnd.\n",
        "{}",
        NULL,
        "Begin.\nEnd.\n"
    );
}